

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

size_t __thiscall apngasm::APNGAsm::addFrame(APNGAsm *this,APNGFrame *frame)

{
  char cVar1;
  
  cVar1 = (**(code **)(*(long *)this->_listener + 0x18))();
  if (cVar1 != '\0') {
    std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::push_back
              (&this->_frames,frame);
    (**(code **)(*(long *)this->_listener + 0x28))(this->_listener,frame);
  }
  return ((long)(this->_frames).
                super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(this->_frames).
               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x430;
}

Assistant:

size_t APNGAsm::addFrame(const APNGFrame &frame)
  {
    if( _listener->onPreAddFrame(frame) )
    {
      _frames.push_back(frame);
      _listener->onPostAddFrame(frame);
    }
    return _frames.size();
  }